

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void DominantCostRangeInit(DominantCostRange *c)

{
  DominantCostRange *c_local;
  
  c->literal_max = 0;
  c->literal_min = 0xffffffffffffffff;
  c->red_max = 0;
  c->red_min = 0xffffffffffffffff;
  c->blue_max = 0;
  c->blue_min = 0xffffffffffffffff;
  return;
}

Assistant:

static void DominantCostRangeInit(DominantCostRange* const c) {
  c->literal_max = 0;
  c->literal_min = WEBP_UINT64_MAX;
  c->red_max = 0;
  c->red_min = WEBP_UINT64_MAX;
  c->blue_max = 0;
  c->blue_min = WEBP_UINT64_MAX;
}